

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

void Ssw_SmlObjAssignConst(Ssw_Sml_t *p,Aig_Obj_t *pObj,int fConst1,int iFrame)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x234,"void Ssw_SmlObjAssignConst(Ssw_Sml_t *, Aig_Obj_t *, int, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
    iVar1 = p->nWordsFrame;
    if (0 < iVar1) {
      iVar2 = p->nWordsTotal;
      iVar3 = pObj->Id;
      lVar4 = 0;
      do {
        *(uint *)((long)&p[1].pAig +
                 lVar4 * 4 + (long)(iVar1 * iFrame) * 4 + (long)(iVar2 * iVar3) * 4) =
             -(uint)(fConst1 != 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 < p->nWordsFrame);
    }
    return;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                ,0x235,"void Ssw_SmlObjAssignConst(Ssw_Sml_t *, Aig_Obj_t *, int, int)");
}

Assistant:

void Ssw_SmlObjAssignConst( Ssw_Sml_t * p, Aig_Obj_t * pObj, int fConst1, int iFrame )
{
    unsigned * pSims;
    int i;
    assert( iFrame < p->nFrames );
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id ) + p->nWordsFrame * iFrame;
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = fConst1? ~(unsigned)0 : 0;
}